

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_cleanup(archive_read *a)

{
  void *__ptr;
  void *pvVar1;
  void *__ptr_00;
  
  __ptr = a->format->data;
  if (*(char *)((long)__ptr + 0x148) != '\0') {
    cm_zlib_inflateEnd((z_streamp)((long)__ptr + 0xd8));
  }
  free(*(void **)((long)__ptr + 200));
  __ptr_00 = *(void **)((long)__ptr + 0x60);
  if (*(void **)((long)__ptr + 0x60) != (void *)0x0) {
    while (__ptr_00 != (void *)0x0) {
      pvVar1 = *(void **)((long)__ptr_00 + 0x18);
      archive_string_free((archive_string *)((long)__ptr_00 + 0x48));
      free(__ptr_00);
      __ptr_00 = pvVar1;
    }
  }
  free(__ptr);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_zip_cleanup(struct archive_read *a)
{
	struct zip *zip;
	struct zip_entry *zip_entry, *next_zip_entry;

	zip = (struct zip *)(a->format->data);
#ifdef HAVE_ZLIB_H
	if (zip->stream_valid)
		inflateEnd(&zip->stream);
	free(zip->uncompressed_buffer);
#endif
	if (zip->zip_entries) {
		zip_entry = zip->zip_entries;
		while (zip_entry != NULL) {
			next_zip_entry = zip_entry->next;
			archive_string_free(&zip_entry->rsrcname);
			free(zip_entry);
			zip_entry = next_zip_entry;
		}
	}
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}